

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O2

void __thiscall
solitaire::graphics::Renderer::renderStockPileCoveredCards
          (Renderer *this,Cards *pileCards,SelectedCardIndex *selectedCardIndex,
          StockPileCollider *collider)

{
  int iVar1;
  int iVar2;
  Position cardPosition;
  
  cardPosition.x = 0x10;
  cardPosition.y = 0x1e;
  iVar1 = (*collider->_vptr_StockPileCollider[4])(collider);
  iVar2 = 0x10;
  while (iVar2 <= iVar1) {
    renderCardBack(this,&cardPosition);
    iVar2 = cardPosition.x + 2;
    cardPosition.x = iVar2;
  }
  return;
}

Assistant:

void Renderer::renderStockPileCoveredCards(
    const Cards& pileCards, const SelectedCardIndex& selectedCardIndex,
    const StockPileCollider& collider) const
{
    auto cardPosition = Layout::stockPilePosition;
    const auto coveredCardsPosition = collider.getCoveredCardsPosition();

    while (cardPosition.x <= coveredCardsPosition.x) {
        renderCardBack(cardPosition);
        cardPosition.x += Layout::stockPileCardsSpacing;
    }
}